

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

uint32 __thiscall
Js::TypedArrayBase::ValidateAndReturnIndex
          (TypedArrayBase *this,Var index,bool *skipOperation,bool *isNumericIndex)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptString *aValue;
  double local_40;
  bool *local_38;
  
  *skipOperation = false;
  *isNumericIndex = true;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  local_38 = skipOperation;
  if (((ulong)index & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)index & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)index & 0xffff000000000000) != 0x1000000000000) {
      local_40 = 0.0;
      bVar3 = VarIs<Js::JavascriptString>(index);
      if (bVar3) {
        aValue = VarTo<Js::JavascriptString>(index);
        BVar4 = JavascriptConversion::CanonicalNumericIndexString
                          (aValue,&local_40,
                           (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject
                               .super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
        if (BVar4 == 0) {
          *isNumericIndex = false;
        }
        else {
          bVar3 = NumberUtilities::IsSpecial(local_40,0x8000000000000000);
          if (!bVar3) goto LAB_00d5df08;
          *local_38 = true;
        }
        index = (Var)0x0;
      }
      else {
        if ((ulong)index >> 0x32 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                      ,0xd4,"(Is(aValue))",
                                      "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar3) goto LAB_00d5df36;
          *puVar5 = 0;
        }
        local_40 = (double)((ulong)index ^ 0xfffc000000000000);
LAB_00d5df08:
        index = (Var)(long)local_40;
        if (((local_40 != (double)((ulong)index & 0xffffffff)) ||
            (NAN(local_40) || NAN((double)((ulong)index & 0xffffffff)))) ||
           ((this->super_ArrayBufferParent).super_ArrayObject.length <= (uint)index)) {
          *local_38 = true;
        }
      }
      goto LAB_00d5de0e;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d5df36;
    *puVar5 = 0;
  }
  if (((ulong)index & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00d5df36:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  *local_38 = uVar1 <= (uint)index || (int)(uint)index < 0;
LAB_00d5de0e:
  return (uint32)index;
}

Assistant:

_Use_decl_annotations_ uint32 TypedArrayBase::ValidateAndReturnIndex(Js::Var index, bool * skipOperation, bool * isNumericIndex)
    {
        *skipOperation = false;
        *isNumericIndex = true;
        uint32 length = GetLength();

        if (TaggedInt::Is(index))
        {
            int32 indexInt = TaggedInt::ToInt32(index);
            *skipOperation = (indexInt < 0 || (uint32)indexInt >= length);
            return (uint32)indexInt;
        }
        else
        {
            double dIndexValue = 0;
            if (VarIs<JavascriptString>(index))
            {
                if (JavascriptConversion::CanonicalNumericIndexString(VarTo<JavascriptString>(index), &dIndexValue, GetScriptContext()))
                {
                    if (JavascriptNumber::IsNegZero(dIndexValue))
                    {
                        *skipOperation = true;
                        return 0;
                    }
                    // If this is numeric index embedded in string, perform regular numeric index checks below
                }
                else
                {
                    // not numeric index, go the [[Set]] path to add as string property
                    *isNumericIndex = false;
                    return 0;
                }
            }
            else
            {
                // JavascriptNumber::Is_NoTaggedIntCheck(index)
                dIndexValue = JavascriptNumber::GetValue(index);
            }

            // OK to lose data because we want to verify ToInteger()
            uint32 uint32Index = (uint32)dIndexValue;

            // IsInteger()
            if ((double)uint32Index != dIndexValue)
            {
                *skipOperation = true;
            }
            // index >= length
            else if (uint32Index >= GetLength())
            {
                *skipOperation = true;
            }
            return uint32Index;
        }
    }